

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checks.h
# Opt level: O3

void UnitTest::CheckArrayEqual<int[3],int[3]>
               (TestResults *results,int (*expected) [3],int (*actual) [3],int count,
               TestDetails *details)

{
  bool bVar1;
  ostream *poVar2;
  char *failure;
  ulong uVar3;
  ulong uVar4;
  int expectedIndex;
  MemoryOutStream stream;
  undefined1 local_1c8 [408];
  
  if (0 < count) {
    uVar4 = (ulong)(uint)count;
    bVar1 = true;
    uVar3 = 0;
    do {
      bVar1 = (bool)(bVar1 & (*expected)[uVar3] == (*actual)[uVar3]);
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
    if (!bVar1) {
      MemoryOutStream::MemoryOutStream((MemoryOutStream *)local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"Expected [ ",0xb);
      uVar3 = 0;
      do {
        poVar2 = (ostream *)std::ostream::operator<<(local_1c8,(*expected)[uVar3]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        uVar3 = uVar3 + 1;
      } while (uVar4 != uVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"] but was [ ",0xc);
      uVar3 = 0;
      do {
        poVar2 = (ostream *)std::ostream::operator<<(local_1c8,(*actual)[uVar3]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        uVar3 = uVar3 + 1;
      } while (uVar4 != uVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"]",1);
      failure = MemoryOutStream::GetText((MemoryOutStream *)local_1c8);
      TestResults::OnTestFailure(results,details,failure);
      MemoryOutStream::~MemoryOutStream((MemoryOutStream *)local_1c8,&MemoryOutStream::VTT);
      std::ios_base::~ios_base((ios_base *)(local_1c8 + 0x90));
    }
  }
  return;
}

Assistant:

void CheckArrayEqual(TestResults& results, Expected const& expected, Actual const& actual,
                int const count, TestDetails const& details)
{
    bool equal = true;
    for (int i = 0; i < count; ++i)
        equal &= (expected[i] == actual[i]);

    if (!equal)
    {
        UnitTest::MemoryOutStream stream;

		stream << "Expected [ ";

		for (int expectedIndex = 0; expectedIndex < count; ++expectedIndex)
            stream << expected[expectedIndex] << " ";

		stream << "] but was [ ";

		for (int actualIndex = 0; actualIndex < count; ++actualIndex)
            stream << actual[actualIndex] << " ";

		stream << "]";

        results.OnTestFailure(details, stream.GetText());
    }
}